

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListExpression.cpp
# Opt level: O2

void __thiscall hdc::ListExpression::~ListExpression(ListExpression *this)

{
  pointer ppEVar1;
  Expression *pEVar2;
  int i;
  ulong uVar3;
  
  (this->super_Expression).super_Statement.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_0019af70;
  uVar3 = 0;
  while( true ) {
    ppEVar1 = (this->expressions).
              super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->expressions).
                      super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar3)
    break;
    pEVar2 = ppEVar1[uVar3];
    if (pEVar2 != (Expression *)0x0) {
      (**(code **)((long)(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode + 0x10))();
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::~_Vector_base
            (&(this->expressions).
              super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

ListExpression::~ListExpression() {
    for (int i = 0; i < expressions.size(); ++i) {
        delete expressions[i];
    }
}